

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_msa_ld_d_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,target_ulong addr)

{
  uint idx;
  TCGMemOpIdx oi_00;
  fpr_t *pfVar1;
  uint64_t uVar2;
  uintptr_t unaff_retaddr;
  TCGMemOpIdx oi;
  wr_t *pwd;
  target_ulong addr_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  idx = cpu_mmu_index(env,false);
  oi_00 = make_memop_idx(MO_AMASK|MO_BEQ,idx);
  uVar2 = helper_be_ldq_mmu_mips64((CPUArchState_conflict10 *)env,addr,oi_00,unaff_retaddr);
  pfVar1->d = uVar2;
  uVar2 = helper_be_ldq_mmu_mips64((CPUArchState_conflict10 *)env,addr + 8,oi_00,unaff_retaddr);
  (&pfVar1->d)[1] = uVar2;
  return;
}

Assistant:

void helper_msa_ld_d(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    MEMOP_IDX(DF_DOUBLE)
    pwd->d[0] = helper_ret_ldq_mmu(env, addr + (0 << DF_DOUBLE), oi, GETPC());
    pwd->d[1] = helper_ret_ldq_mmu(env, addr + (1 << DF_DOUBLE), oi, GETPC());
}